

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_line.cpp
# Opt level: O2

int ON_ArePointsOnLine(int dim,bool is_rat,int count,int stride,double *point,ON_BoundingBox *bbox,
                      ON_Line *line,double tolerance)

{
  bool bVar1;
  int iVar2;
  ON_3dPoint *pOVar3;
  char *sFormat;
  uint i;
  uint i_00;
  int iVar4;
  uint i_01;
  double dVar5;
  double local_a0;
  int local_94;
  double *local_80;
  ON_3dPoint Q;
  ON_3dVector local_48;
  
  if (0 < count) {
    bVar1 = ON_Line::IsValid(line);
    if (bVar1) {
      bVar1 = ON_BoundingBox::IsValid(bbox);
      if (bVar1) {
        bVar1 = ON_IsValid(tolerance);
        if (tolerance < 0.0 || !bVar1) {
          sFormat = "tolerance parameter not valid";
          iVar4 = 0xfa;
        }
        else if (dim - 4U < 0xfffffffe) {
          sFormat = "dim parameter not valid";
          iVar4 = 0xff;
        }
        else if (point == (double *)0x0) {
          sFormat = "point parameter not valid";
          iVar4 = 0x104;
        }
        else if (stride < (int)((uint)is_rat + dim)) {
          sFormat = "stride parameter not valid";
          iVar4 = 0x109;
        }
        else {
          local_a0 = tolerance;
          if ((tolerance == 0.0) && (!NAN(tolerance))) {
            local_a0 = ON_BoundingBox::Tolerance(bbox);
          }
          Q.z = ON_3dPoint::Origin.z;
          Q.x = ON_3dPoint::Origin.x;
          Q.y = ON_3dPoint::Origin.y;
          if (count == 1) {
            iVar4 = 2;
          }
          else {
            ON_BoundingBox::Diagonal(&local_48,bbox);
            dVar5 = ON_3dVector::Length(&local_48);
            iVar4 = 2 - (uint)(local_a0 < dVar5);
          }
          for (i_00 = 0; (iVar4 != 0 && (i_00 < 2)); i_00 = i_00 + 1) {
            pOVar3 = ON_BoundingBox::operator[](bbox,i_00);
            Q.x = pOVar3->x;
            for (i = 0; (iVar4 != 0 && (i < 2)); i = i + 1) {
              pOVar3 = ON_BoundingBox::operator[](bbox,i);
              Q.y = pOVar3->y;
              for (i_01 = 0; (iVar4 != 0 && (i_01 < 2)); i_01 = i_01 + 1) {
                pOVar3 = ON_BoundingBox::operator[](bbox,i_01);
                Q.z = pOVar3->z;
                ON_Line::ClosestPointTo((ON_3dPoint *)&local_48,line,&Q);
                dVar5 = ON_3dPoint::DistanceTo(&Q,(ON_3dPoint *)&local_48);
                iVar2 = 0;
                if (dVar5 <= local_a0) {
                  iVar2 = iVar4;
                }
                iVar4 = iVar2;
              }
            }
          }
          if (iVar4 != 0) {
            return iVar4;
          }
          Q.z = ON_3dPoint::Origin.z;
          Q.x = ON_3dPoint::Origin.x;
          Q.y = ON_3dPoint::Origin.y;
          if (count == 1) {
            iVar4 = 2;
          }
          else {
            ON_BoundingBox::Diagonal(&local_48,bbox);
            dVar5 = ON_3dVector::Length(&local_48);
            iVar4 = 2 - (uint)(local_a0 < dVar5);
          }
          local_94 = count;
          if (!is_rat) {
            while( true ) {
              bVar1 = local_94 == 0;
              local_94 = local_94 + -1;
              if (bVar1) {
                return iVar4;
              }
              memcpy(&Q,point,(ulong)(uint)(dim << 3));
              ON_Line::ClosestPointTo((ON_3dPoint *)&local_48,line,&Q);
              dVar5 = ON_3dPoint::DistanceTo(&Q,(ON_3dPoint *)&local_48);
              if (local_a0 < dVar5) break;
              point = point + (uint)stride;
            }
            return 0;
          }
          local_80 = point;
          while( true ) {
            bVar1 = local_94 == 0;
            local_94 = local_94 + -1;
            if (bVar1) {
              return iVar4;
            }
            dVar5 = local_80[(uint)dim];
            if ((dVar5 == 0.0) && (!NAN(dVar5))) break;
            ON_ArrayScale(dim,1.0 / dVar5,local_80,&Q.x);
            ON_Line::ClosestPointTo((ON_3dPoint *)&local_48,line,&Q);
            dVar5 = ON_3dPoint::DistanceTo(&Q,(ON_3dPoint *)&local_48);
            if (local_a0 < dVar5) {
              return 0;
            }
            local_80 = local_80 + (uint)stride;
          }
          sFormat = "rational point has zero weight";
          iVar4 = 299;
        }
      }
      else {
        sFormat = "bbox parameter not valid";
        iVar4 = 0xf5;
      }
    }
    else {
      sFormat = "line parameter not valid";
      iVar4 = 0xf0;
    }
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_line.cpp"
               ,iVar4,"",sFormat);
  }
  return 0;
}

Assistant:

int ON_ArePointsOnLine( // returns 0=no, 1 = yes, 2 = pointset is (to tolerance) a single point on the line
        int dim,     // 2 or 3
        bool is_rat,
        int count, 
        int stride, const double* point,
        const ON_BoundingBox& bbox, // if needed, use ON_GetBoundingBox(dim,is_rat,count,stride,point)
        const ON_Line& line,  // line to test
        double tolerance
        )
{
  double w;
  int i, j, k;

  if ( count < 1 )
    return 0;

  if ( !line.IsValid() )
  {
    ON_ERROR("line parameter not valid");
    return 0;
  }
  if ( !bbox.IsValid() )
  {
    ON_ERROR("bbox parameter not valid");
    return 0;
  }
  if ( !ON_IsValid(tolerance) || tolerance < 0.0 )
  {
    ON_ERROR("tolerance parameter not valid");
    return 0;
  }
  if ( dim < 2 || dim > 3 )
  {
    ON_ERROR("dim parameter not valid");
    return 0;
  }
  if ( 0 == point )
  {
    ON_ERROR("point parameter not valid");
    return 0;
  }
  if ( stride < (is_rat?(dim+1):dim) )
  {
    ON_ERROR("stride parameter not valid");
    return 0;
  }

  int rc = 0;

  if ( tolerance == 0.0 ) {
    tolerance = bbox.Tolerance();
  }

  ON_3dPoint Q(ON_3dPoint::Origin);

  // test bounding box to quickly detect the common coordinate axis cases
  rc = (count == 1 || bbox.Diagonal().Length() <= tolerance) ? 2 : 1;
  for ( i = 0; rc && i < 2; i++ ) {
    Q.x = bbox[i].x;
    for ( j = 0; rc && j < 2; j++) {
      Q.y = bbox[j].y;
      for ( k = 0; rc && k < 2; k++) {
        Q.z = bbox[k].z;
        if ( Q.DistanceTo( line.ClosestPointTo( Q ) ) > tolerance )
          rc = 0;
      }
    }
  }

  if ( !rc ) {
    // test points one by one
    Q = ON_3dPoint::Origin;
    rc = (count == 1 || bbox.Diagonal().Length() <= tolerance) ? 2 : 1;
    if ( is_rat ) {
      for ( i = 0; i < count; i++ ) {
        w = point[dim];
        if ( w == 0.0 ) {
          ON_ERROR("rational point has zero weight");
          return 0;
        }
        ON_ArrayScale( dim, 1.0/w, point, &Q.x );
        if ( Q.DistanceTo( line.ClosestPointTo( Q ) ) > tolerance ) {
          rc = 0;
          break;
        }
        point += stride;
      }
    }
    else {
      for ( i = 0; i < count; i++ ) {
        memcpy( &Q.x, point, dim*sizeof(Q.x) );
        if ( Q.DistanceTo( line.ClosestPointTo( Q ) ) > tolerance ) {
          rc = 0;
          break;
        }
        point += stride;
      }
    }
  }

  return rc;
}